

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

int xmlPatternStreamable(xmlPatternPtr comp)

{
  xmlPatternPtr local_18;
  xmlPatternPtr comp_local;
  
  local_18 = comp;
  if (comp == (xmlPatternPtr)0x0) {
    comp_local._4_4_ = -1;
  }
  else {
    for (; local_18 != (xmlPatternPtr)0x0; local_18 = local_18->next) {
      if (local_18->stream == (xmlStreamCompPtr)0x0) {
        return 0;
      }
    }
    comp_local._4_4_ = 1;
  }
  return comp_local._4_4_;
}

Assistant:

int
xmlPatternStreamable(xmlPatternPtr comp) {
    if (comp == NULL)
        return(-1);
    while (comp != NULL) {
        if (comp->stream == NULL)
	    return(0);
	comp = comp->next;
    }
    return(1);
}